

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.cpp
# Opt level: O2

void __thiscall duckdb::BinarySerializer::WriteValue(BinarySerializer *this,uint16_t value)

{
  VarIntEncode<unsigned_short>(this,value);
  return;
}

Assistant:

void BinarySerializer::WriteValue(uint16_t value) {
	VarIntEncode(value);
}